

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O2

void __thiscall FFT_Benchmark1e4_Test::TestBody(FFT_Benchmark1e4_Test *this)

{
  int iVar1;
  ulong uVar2;
  char *message;
  undefined1 local_98 [8];
  vector<long_long,_std::allocator<long_long>_> want;
  vector<long_long,_std::allocator<long_long>_> res;
  AssertionResult gtest_ar;
  vector<long_long,_std::allocator<long_long>_> p1;
  vector<long_long,_std::allocator<long_long>_> p2;
  AssertHelper local_20;
  
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,10000,
             (allocator_type *)
             &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10000,
             (allocator_type *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)gtest_ar.message_.ptr_ >> 3);
      uVar2 = uVar2 + 1) {
    iVar1 = rand();
    (&(gtest_ar.message_.ptr_)->_M_dataplus)[uVar2]._M_p = (pointer)(long)(iVar1 % 200000 + -100000)
    ;
  }
  for (uVar2 = 0;
      uVar2 < (ulong)((long)p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start -
                      (long)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 3); uVar2 = uVar2 + 1) {
    iVar1 = rand();
    p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[uVar2] = (long)(iVar1 % 200000 + -100000);
  }
  multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)
                      &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,
                      (vector<long_long,_std::allocator<long_long>_> *)
                      &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10);
  multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)local_98,
                (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,
                (vector<long_long,_std::allocator<long_long>_> *)
                &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)local_98,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10);
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((internal *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"want","res",
             (vector<long_long,_std::allocator<long_long>_> *)local_98,
             (vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((char)res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message
              ((Message *)
               &p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=
              (&local_20,
               (Message *)
               &p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)local_98);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)
             &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(FFT, Benchmark1e4) {
    int n = 1e4;
    int range = 1e5; //numbers from -range to range
    vector<ll> p1(n), p2(n);
    rep(j, 0, p1.size()) p1[j] = rand() % (2 * range) - range;
    rep(j, 0, p2.size()) p2[j] = rand() % (2 * range) - range;
    vector<ll> res = multiplyPolynomials(p1, p2);
    p1.resize(10), p2.resize(10);
    vector<ll> want = multiplyNaive(p1, p2);
    want.resize(10), res.resize(10);
    EXPECT_EQ(want, res);
}